

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

TextureMapping2DHandle
pbrt::TextureMapping2DHandle::Create
          (ParameterDictionary *parameters,Transform *renderFromTexture,FileLoc *loc,Allocator alloc
          )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  UVMapping2D *this;
  allocator<char> *in_RSI;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  in_RDI;
  Float FVar4;
  undefined8 uVar5;
  Vector3f VVar6;
  Tuple3<pbrt::Vector3,_float> TVar7;
  Float dv;
  Float du;
  Float sv;
  Float su;
  string type;
  float in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  ParameterDictionary *in_stack_fffffffffffffb60;
  Transform *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  float *in_stack_fffffffffffffb78;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffb80;
  polymorphic_allocator<std::byte> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  allocator<char> *__a;
  string *in_stack_fffffffffffffb98;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  string *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  ParameterDictionary *in_stack_fffffffffffffbb8;
  undefined8 local_339;
  Float local_318;
  allocator<char> local_311;
  string local_310 [36];
  Float local_2ec;
  undefined8 local_2e8;
  float local_2e0;
  allocator<char> local_2c9;
  string local_2c8 [32];
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  allocator<char> local_279;
  string local_278 [32];
  undefined8 local_258;
  float local_250;
  undefined4 local_148;
  allocator<char> local_141;
  string local_140 [32];
  Float local_120;
  allocator<char> local_119;
  string local_118 [32];
  Float local_f8;
  allocator<char> local_f1;
  string local_f0 [32];
  Float local_d0;
  allocator<char> local_c9;
  string local_c8 [32];
  Float local_a8;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [48];
  allocator<char> *local_18;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90);
  ParameterDictionary::GetOneString
            (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb60,
                          (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90);
    FVar4 = ParameterDictionary::GetOneFloat
                      (in_stack_fffffffffffffb60,
                       (string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0.0);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    local_a8 = FVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90);
    FVar4 = ParameterDictionary::GetOneFloat
                      (in_stack_fffffffffffffb60,
                       (string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0.0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    local_d0 = FVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90);
    FVar4 = ParameterDictionary::GetOneFloat
                      (in_stack_fffffffffffffb60,
                       (string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0.0);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    local_f8 = FVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90);
    FVar4 = ParameterDictionary::GetOneFloat
                      (in_stack_fffffffffffffb60,
                       (string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0.0);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    local_120 = FVar4;
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::UVMapping2D,float&,float&,float&,float&>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
               (float *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (float *)in_stack_fffffffffffffb68,(float *)in_stack_fffffffffffffb60);
    TaggedPointer<pbrt::UVMapping2D>
              ((TextureMapping2DHandle *)in_stack_fffffffffffffb60,
               (UVMapping2D *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb60,
                            (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    if (bVar3) {
      Inverse((Transform *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::SphericalMapping2D,pbrt::Transform>
                ((polymorphic_allocator<std::byte> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
      TaggedPointer<pbrt::SphericalMapping2D>
                ((TextureMapping2DHandle *)in_stack_fffffffffffffb60,
                 (SphericalMapping2D *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)
                );
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb60,
                              (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
      ;
      if (bVar3) {
        Inverse((Transform *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        pstd::pmr::polymorphic_allocator<std::byte>::
        new_object<pbrt::CylindricalMapping2D,pbrt::Transform>
                  ((polymorphic_allocator<std::byte> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   in_stack_fffffffffffffb68);
        TaggedPointer<pbrt::CylindricalMapping2D>
                  ((TextureMapping2DHandle *)in_stack_fffffffffffffb60,
                   (CylindricalMapping2D *)
                   CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb60,
                                (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ));
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90)
          ;
          uVar5 = 0;
          Vector3<float>::Vector3
                    ((Vector3<float> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                     in_stack_fffffffffffffb58,0.0);
          VVar6 = ParameterDictionary::GetOneVector3f
                            ((ParameterDictionary *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb98,(Vector3f *)in_stack_fffffffffffffb90);
          local_290 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar2._8_8_ = uVar5;
          auVar2._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          local_298 = vmovlpd_avx(auVar2);
          local_258 = local_298;
          local_250 = local_290;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     (char *)in_stack_fffffffffffffb98,(allocator<char> *)in_stack_fffffffffffffb90)
          ;
          uVar5 = 0;
          Vector3<float>::Vector3
                    ((Vector3<float> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                     in_stack_fffffffffffffb58,0.0);
          TVar7 = (Tuple3<pbrt::Vector3,_float>)
                  ParameterDictionary::GetOneVector3f
                            ((ParameterDictionary *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb98,(Vector3f *)in_stack_fffffffffffffb90);
          local_2e0 = TVar7.z;
          auVar1._8_8_ = uVar5;
          auVar1._0_8_ = TVar7._0_8_;
          local_2e8 = vmovlpd_avx(auVar1);
          __s = &local_311;
          __a = local_18;
          local_2a8 = local_2e8;
          local_2a0 = local_2e0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(TVar7.z,in_stack_fffffffffffffba0),(char *)__s,__a);
          local_2ec = ParameterDictionary::GetOneFloat
                                (in_stack_fffffffffffffb60,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0.0);
          this_00 = (polymorphic_allocator<std::byte> *)&local_339;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(TVar7.z,in_stack_fffffffffffffba0),(char *)__s,__a);
          local_318 = ParameterDictionary::GetOneFloat
                                (in_stack_fffffffffffffb60,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0.0);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::PlanarMapping2D,pbrt::Vector3<float>,pbrt::Vector3<float>,float,float>
                    (this_00,(Vector3<float> *)local_18,
                     (Vector3<float> *)CONCAT44(local_318,in_stack_fffffffffffffb70),
                     (float *)in_stack_fffffffffffffb68,(float *)in_stack_fffffffffffffb60);
          TaggedPointer<pbrt::PlanarMapping2D>
                    ((TextureMapping2DHandle *)in_stack_fffffffffffffb60,
                     (PlanarMapping2D *)
                     CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          std::__cxx11::string::~string((string *)((long)&local_339 + 1));
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          std::__cxx11::string::~string(local_310);
          std::allocator<char>::~allocator(&local_311);
          std::__cxx11::string::~string(local_2c8);
          std::allocator<char>::~allocator(&local_2c9);
          std::__cxx11::string::~string(local_278);
          std::allocator<char>::~allocator(&local_279);
        }
        else {
          Error<std::__cxx11::string&>
                    ((FileLoc *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     (char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
          this = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::UVMapping2D>
                           ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb60);
          TaggedPointer<pbrt::UVMapping2D>
                    ((TextureMapping2DHandle *)this,
                     (UVMapping2D *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        }
      }
    }
  }
  local_148 = 1;
  std::__cxx11::string::~string(local_48);
  return (TextureMapping2DHandle)
         (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          )in_RDI.bits;
}

Assistant:

TextureMapping2DHandle TextureMapping2DHandle::Create(
    const ParameterDictionary &parameters, const Transform &renderFromTexture,
    const FileLoc *loc, Allocator alloc) {
    std::string type = parameters.GetOneString("mapping", "uv");
    if (type == "uv") {
        Float su = parameters.GetOneFloat("uscale", 1.);
        Float sv = parameters.GetOneFloat("vscale", 1.);
        Float du = parameters.GetOneFloat("udelta", 0.);
        Float dv = parameters.GetOneFloat("vdelta", 0.);
        return alloc.new_object<UVMapping2D>(su, sv, du, dv);
    } else if (type == "spherical")
        return alloc.new_object<SphericalMapping2D>(Inverse(renderFromTexture));
    else if (type == "cylindrical")
        return alloc.new_object<CylindricalMapping2D>(Inverse(renderFromTexture));
    else if (type == "planar")
        return alloc.new_object<PlanarMapping2D>(
            parameters.GetOneVector3f("v1", Vector3f(1, 0, 0)),
            parameters.GetOneVector3f("v2", Vector3f(0, 1, 0)),
            parameters.GetOneFloat("udelta", 0.f), parameters.GetOneFloat("vdelta", 0.f));
    else {
        Error(loc, "2D texture mapping \"%s\" unknown", type);
        return alloc.new_object<UVMapping2D>();
    }
}